

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kclient.cpp
# Opt level: O3

string * __thiscall
Kraken::KClient::private_method
          (string *__return_storage_ptr__,KClient *this,string *method,KInput *input)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  int iVar4;
  undefined8 *puVar5;
  long *plVar6;
  ostream *poVar7;
  undefined8 uVar8;
  int *piVar9;
  char *pcVar10;
  runtime_error *prVar11;
  size_type *psVar12;
  string key_header;
  string postdata;
  string sign_header;
  string path;
  string nonce;
  string method_url;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8 [3];
  ios_base local_158 [112];
  char acStack_e8 [152];
  string local_50 [32];
  
  std::operator+(&local_268,"/",&this->version_);
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_268);
  paVar2 = &local_1c8[0].field_2;
  psVar12 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1c8[0].field_2._0_8_ = *psVar12;
    local_1c8[0].field_2._8_8_ = puVar5[3];
    local_1c8[0]._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1c8[0].field_2._0_8_ = *psVar12;
    local_1c8[0]._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_1c8[0]._M_string_length = puVar5[1];
  *puVar5 = psVar12;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_1c8,(ulong)(method->_M_dataplus)._M_p);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  psVar12 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_228.field_2._M_allocated_capacity = *psVar12;
    local_228.field_2._8_8_ = plVar6[3];
  }
  else {
    local_228.field_2._M_allocated_capacity = *psVar12;
    local_228._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_228._M_string_length = plVar6[1];
  *plVar6 = (long)psVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  std::operator+(&local_1e8,&this->url_,&local_228);
  curl_easy_setopt(this->curl_,0x2712,local_1e8._M_dataplus._M_p);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  iVar4 = gettimeofday((timeval *)&local_288,(__timezone_ptr_t)0x0);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"gettimeofday() failed: ",0x17);
    piVar9 = __errno_location();
    pcVar10 = strerror(*piVar9);
    std::operator<<((ostream *)local_1c8,pcVar10);
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,(string *)&local_268);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar3 = *(long *)(local_1c8[0]._M_dataplus._M_p + -0x18);
  if (acStack_e8[lVar3 + 1] == '\0') {
    std::ios::widen((char)&local_288 + (char)lVar3 + -0x40);
    acStack_e8[lVar3 + 1] = '\x01';
  }
  acStack_e8[lVar3] = '0';
  *(undefined8 *)((long)&local_1c8[0].field_2 + *(long *)(local_1c8[0]._M_dataplus._M_p + -0x18)) =
       10;
  poVar7 = std::ostream::_M_insert<long>((long)local_1c8);
  *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 6;
  std::ostream::_M_insert<long>((long)poVar7);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  std::operator+(&local_268,"nonce=",&local_208);
  if ((input->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) goto LAB_0010deb7;
  paVar1 = &local_288.field_2;
  local_288._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_288,local_268._M_dataplus._M_p,
             local_268._M_dataplus._M_p + local_268._M_string_length);
  std::__cxx11::string::append((char *)&local_288);
  build_query(&local_248,input);
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar1) {
    uVar8 = local_288.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_248._M_string_length + local_288._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      uVar8 = local_248.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_248._M_string_length + local_288._M_string_length) goto LAB_0010de0c;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_248,0,(char *)0x0,(ulong)local_288._M_dataplus._M_p);
  }
  else {
LAB_0010de0c:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_248._M_dataplus._M_p);
  }
  psVar12 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1c8[0].field_2._0_8_ = *psVar12;
    local_1c8[0].field_2._8_8_ = puVar5[3];
    local_1c8[0]._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1c8[0].field_2._0_8_ = *psVar12;
    local_1c8[0]._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_1c8[0]._M_string_length = puVar5[1];
  *puVar5 = psVar12;
  puVar5[1] = 0;
  *(undefined1 *)psVar12 = 0;
  std::__cxx11::string::operator=((string *)&local_268,(string *)local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar1) {
    operator_delete(local_288._M_dataplus._M_p);
  }
LAB_0010deb7:
  curl_easy_setopt(this->curl_,0x271f,local_268._M_dataplus._M_p);
  std::operator+(&local_288,"API-Key: ",&this->key_);
  signature(local_1c8,this,&local_228,&local_208,&local_268);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0x11d0f0);
  psVar12 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_248.field_2._M_allocated_capacity = *psVar12;
    local_248.field_2._8_8_ = plVar6[3];
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  }
  else {
    local_248.field_2._M_allocated_capacity = *psVar12;
    local_248._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_248._M_string_length = plVar6[1];
  *plVar6 = (long)psVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c8[0]._M_dataplus._M_p);
  }
  uVar8 = curl_slist_append(0,local_288._M_dataplus._M_p);
  uVar8 = curl_slist_append(uVar8,local_248._M_dataplus._M_p);
  curl_easy_setopt(this->curl_,0x2727,uVar8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  curl_easy_setopt(this->curl_,0x2711,__return_storage_ptr__);
  iVar4 = curl_easy_perform(this->curl_);
  curl_slist_free_all(uVar8);
  if (iVar4 == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p);
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"curl_easy_perform() failed: ",0x1c);
  pcVar10 = (char *)curl_easy_strerror(iVar4);
  std::operator<<((ostream *)local_1c8,pcVar10);
  prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar11,local_50);
  __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string KClient::private_method(const std::string& method, 
				 const KInput& input) const
{   
   // build method URL
   std::string path = "/" + version_ + "/private/" + method;
   std::string method_url = url_ + path;

   curl_easy_setopt(curl_, CURLOPT_URL, method_url.c_str());

   // create a nonce and and postdata 
   std::string nonce = create_nonce();
   std::string postdata = "nonce=" + nonce;

   // if 'input' is not empty generate other postdata
   if (!input.empty())
      postdata = postdata + "&" + build_query(input);
   curl_easy_setopt(curl_, CURLOPT_POSTFIELDS, postdata.c_str());

   // add custom header
   curl_slist* chunk = NULL;

   std::string key_header =  "API-Key: "  + key_;
   std::string sign_header = "API-Sign: " + signature(path, nonce, postdata);

   chunk = curl_slist_append(chunk, key_header.c_str());
   chunk = curl_slist_append(chunk, sign_header.c_str());
   curl_easy_setopt(curl_, CURLOPT_HTTPHEADER, chunk);
   
   // where CURL write callback function stores the response
   std::string response;
   curl_easy_setopt(curl_, CURLOPT_WRITEDATA, static_cast<void*>(&response));

   // perform CURL request
   CURLcode result = curl_easy_perform(curl_);

   // free the custom headers
   curl_slist_free_all(chunk);
  
   // check perform result
   if (result != CURLE_OK) {
      std::ostringstream oss;
      oss << "curl_easy_perform() failed: " << curl_easy_strerror(result);
      throw std::runtime_error(oss.str());
   }
   
   return response;
}